

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubModel.cpp
# Opt level: O0

void iDynTree::computeTransformToTraversalBase
               (Model *fullModel,Traversal *subModelTraversal,JointPosDoubleArray *jointPos,
               LinkPositions *traversalBase_H_link)

{
  IJoint *pIVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  Transform *pTVar5;
  LinkIndex LVar6;
  LinkIndex LVar7;
  Traversal *in_RCX;
  undefined8 in_RDX;
  IJointConstPtr toParentJoint;
  LinkConstPtr parentLink;
  LinkConstPtr visitedLink;
  uint traversalEl;
  TraversalIndex in_stack_fffffffffffffeb8;
  Traversal *in_stack_fffffffffffffec0;
  Transform local_100 [96];
  Transform local_a0 [96];
  IJoint *local_40;
  Link *local_38;
  Link *local_30;
  uint local_24;
  Traversal *local_20;
  undefined8 local_18;
  
  local_24 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  while( true ) {
    uVar2 = local_24;
    uVar4 = Traversal::getNrOfVisitedLinks((Traversal *)0x46efba);
    if (uVar4 <= uVar2) break;
    local_30 = Traversal::getLink(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_38 = Traversal::getParentLink(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    local_40 = Traversal::getParentJoint(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (local_38 == (Link *)0x0) {
      iDynTree::Transform::Identity();
      Link::getIndex(local_30);
      pTVar5 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      iDynTree::Transform::operator=(pTVar5,local_a0);
    }
    else {
      in_stack_fffffffffffffec0 = local_20;
      Link::getIndex(local_38);
      pTVar5 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      uVar3 = local_18;
      pIVar1 = local_40;
      LVar6 = Link::getIndex(local_38);
      LVar7 = Link::getIndex(local_30);
      (*pIVar1->_vptr_IJoint[10])(pIVar1,uVar3,LVar6,LVar7);
      iDynTree::Transform::operator*(local_100,pTVar5);
      Link::getIndex(local_30);
      pTVar5 = LinkPositions::operator()
                         ((LinkPositions *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      iDynTree::Transform::operator=(pTVar5,local_100);
    }
    local_24 = local_24 + 1;
  }
  return;
}

Assistant:

void computeTransformToTraversalBase(const Model& fullModel,
                                     const Traversal& subModelTraversal,
                                     const JointPosDoubleArray& jointPos,
                                           LinkPositions& traversalBase_H_link)
{
    for(unsigned int traversalEl=0; traversalEl < subModelTraversal.getNrOfVisitedLinks(); traversalEl++)
    {
        LinkConstPtr visitedLink = subModelTraversal.getLink(traversalEl);
        LinkConstPtr parentLink  = subModelTraversal.getParentLink(traversalEl);
        IJointConstPtr toParentJoint = subModelTraversal.getParentJoint(traversalEl);

        // If this is the traversal base
        if( parentLink == 0 )
        {
            // If the visited link is the base, the base has no parent.
            // In this case the position of the base with respect to the base is simply
            // an identity transform
            traversalBase_H_link(visitedLink->getIndex()) = iDynTree::Transform::Identity();
        }
        else
        {
            // Otherwise we compute the world_H_link transform as:
            // world_H_link = world_H_parentLink * parentLink_H_link
            traversalBase_H_link(visitedLink->getIndex()) =
                traversalBase_H_link(parentLink->getIndex())*
                    toParentJoint->getTransform(jointPos,parentLink->getIndex(),visitedLink->getIndex());
        }
    }

    return;
}